

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O1

void AddGeneratedSource(cmMakefile *makefile,string *filename,GeneratorType genType)

{
  byte bVar1;
  cmSourceFile *this;
  cmState *pcVar2;
  char *__s;
  char *pcVar3;
  size_t sVar4;
  cmSourceGroup *this_00;
  char *__s_00;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this = cmMakefile::GetOrCreateSource(makefile,filename,true);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GENERATED","");
  cmSourceFile::SetProperty(this,&local_88,"1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1));
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SKIP_AUTOGEN","");
  cmSourceFile::SetProperty(this,&local_88,"On");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1));
  }
  if (genType == RCC) {
    pcVar2 = cmMakefile::GetState(makefile);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_68._M_dataplus._M_p = (pointer)0x14;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    *(undefined8 *)local_88._M_dataplus._M_p = 0x5f4343524f545541;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 8) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 9) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 10) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xb) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xc) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xd) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xe) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xf) = 'G';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x10) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x11) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x12) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x13) = 'P';
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    __s = cmState::GetGlobalProperty(pcVar2,&local_88);
  }
  else {
    if (genType != MOC) {
      __s = (char *)0x0;
      goto LAB_0041342c;
    }
    pcVar2 = cmMakefile::GetState(makefile);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_68._M_dataplus._M_p = (pointer)0x14;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    *(undefined8 *)local_88._M_dataplus._M_p = 0x5f434f4d4f545541;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 8) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 9) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 10) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xb) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xc) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xd) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xe) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xf) = 'G';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x10) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x11) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x12) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x13) = 'P';
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    __s = cmState::GetGlobalProperty(pcVar2,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1));
  }
LAB_0041342c:
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    pcVar2 = cmMakefile::GetState(makefile);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_68._M_dataplus._M_p = (pointer)0x14;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    *(undefined8 *)local_88._M_dataplus._M_p = 0x5f4e45474f545541;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 8) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 9) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 10) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xb) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xc) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xd) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xe) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xf) = 'G';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x10) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x11) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x12) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x13) = 'P';
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    __s = cmState::GetGlobalProperty(pcVar2,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  bVar1 = 1;
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    this_00 = (cmSourceGroup *)0x0;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_68._M_dataplus._M_p = (pointer)0x16;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    builtin_strncpy(local_88._M_dataplus._M_p,"SOURCE_GROUP_DELIMITER",0x16);
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    pcVar3 = cmMakefile::GetDefinition(makefile,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar4);
    __s_00 = "\\";
    if (pcVar3 != (char *)0x0) {
      __s_00 = pcVar3;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar4 = strlen(__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s_00,__s_00 + sVar4);
    cmSystemTools::tokenize(&local_48,&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    this_00 = cmMakefile::GetSourceGroup(makefile,&local_48);
    if (this_00 == (cmSourceGroup *)0x0) {
      cmMakefile::AddSourceGroup(makefile,&local_48,(char *)0x0);
      this_00 = cmMakefile::GetSourceGroup(makefile,&local_48);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if (this_00 == (cmSourceGroup *)0x0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar4);
      cmQtAutoGeneratorCommon::Quoted(&local_88,&local_68);
      cmSystemTools::Error
                ("Autogen: Could not create or find source group: ",local_88._M_dataplus._M_p,
                 (char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        (ulong)(local_88.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      this_00 = (cmSourceGroup *)0x0;
      bVar1 = 0;
    }
  }
  if (!(bool)(bVar1 ^ 1 | this_00 == (cmSourceGroup *)0x0)) {
    cmSourceGroup::AddGroupFile(this_00,filename);
  }
  return;
}

Assistant:

static void AddGeneratedSource(cmMakefile* makefile,
                               const std::string& filename,
                               cmQtAutoGeneratorCommon::GeneratorType genType)
{
  cmSourceFile* gFile = makefile->GetOrCreateSource(filename, true);
  gFile->SetProperty("GENERATED", "1");
  gFile->SetProperty("SKIP_AUTOGEN", "On");

  AddToSourceGroup(makefile, filename, genType);
}